

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void ** __thiscall kj::Vector<void*>::add<void*&>(Vector<void*> *this,void **params)

{
  bool bVar1;
  void **ppvVar2;
  void **params_local;
  Vector<void_*> *this_local;
  
  bVar1 = ArrayBuilder<void_*>::isFull((ArrayBuilder<void_*> *)this);
  if (bVar1) {
    Vector<void_*>::grow((Vector<void_*> *)this,0);
  }
  ppvVar2 = fwd<void*&>(params);
  ppvVar2 = ArrayBuilder<void*>::add<void*&>((ArrayBuilder<void*> *)this,ppvVar2);
  return ppvVar2;
}

Assistant:

inline T& add(Params&&... params) {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }